

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

nullres nullcRunFunctionInternal(uint functionID,char *argBuf)

{
  bool bVar1;
  
  if (NULLC::initialized == '\x01') {
    if (NULLC::currExec == 0) {
      bVar1 = ExecutorRegVm::Run(NULLC::executorRegVm,functionID,argBuf);
      if (bVar1) {
        return '\x01';
      }
      NULLC::nullcLastError = ExecutorRegVm::GetErrorMessage(NULLC::executorRegVm);
    }
    else if (NULLC::currExec == 2) {
      NULLC::nullcLastError = "LLVM execution engine is not available";
    }
    else if (NULLC::currExec == 1) {
      bVar1 = ExecutorX86::Run(NULLC::executorX86,functionID,argBuf);
      if (bVar1) {
        return '\x01';
      }
      NULLC::nullcLastError = ExecutorX86::GetErrorMessage(NULLC::executorX86);
    }
    else {
      NULLC::nullcLastError = "Unknown executor code";
    }
  }
  else {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  return '\0';
}

Assistant:

nullres nullcRunFunctionInternal(unsigned functionID, const char* argBuf)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	nullres good = true;

	if(currExec == NULLC_X86)
	{
#ifdef NULLC_BUILD_X86_JIT
		if(!executorX86->Run(functionID, argBuf))
		{
			good = false;
			nullcLastError = executorX86->GetErrorMessage();
		}
#else
		good = false;
		nullcLastError = "X86 JIT execution engine is not available";
#endif
	}
	else if(currExec == NULLC_LLVM)
	{
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
		if(!executorLLVM->Run(functionID, argBuf))
		{
			good = false;
			nullcLastError = executorLLVM->GetErrorMessage();
		}
#else
		good = false;
		nullcLastError = "LLVM execution engine is not available";
#endif
	}
	else if(currExec == NULLC_REG_VM)
	{
#ifndef NULLC_NO_EXECUTOR
		if(!executorRegVm->Run(functionID, argBuf))
		{
			good = false;
			nullcLastError = executorRegVm->GetErrorMessage();
		}
#else
		good = false;
		nullcLastError = "VM execution engine is not available";
#endif
	}
	else
	{
		(void)functionID;
		(void)argBuf;

		good = false;
		nullcLastError = "Unknown executor code";
	}

#if !defined(NULLC_NO_EXECUTOR) && defined(NULLC_REG_VM_PROFILE_INSTRUCTIONS)
	if(currExec == NULLC_REG_VM && functionID == ~0u && enableLogFiles)
	{
		OutputContext outputCtx;

		outputCtx.openStream = openStream;
		outputCtx.writeStream = writeStream;
		outputCtx.closeStream = closeStream;

		outputCtx.outputBuf = outputBuf;
		outputCtx.outputBufSize = NULLC_OUTPUT_BUFFER_SIZE;

		outputCtx.tempBuf = tempOutputBuf;
		outputCtx.tempBufSize = NULLC_TEMP_OUTPUT_BUFFER_SIZE;

		outputCtx.stream = outputCtx.openStream("link_reg_vm_exec.txt");

		if(outputCtx.stream)
		{
			linker->SaveRegVmListing(outputCtx, true);

			outputCtx.closeStream(outputCtx.stream);
			outputCtx.stream = NULL;
		}
	}
#endif

	return good;
}